

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

bool wasm::isDebugEnabled(char *type)

{
  size_type sVar1;
  bool bVar2;
  key_type local_38;
  allocator<char> local_11;
  
  if (debugEnabled == '\x01') {
    if (debugTypesEnabled_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,type,&local_11);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&debugTypesEnabled_abi_cxx11_,&local_38);
      bVar2 = sVar1 != 0;
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool wasm::isDebugEnabled(const char* type) {
  if (!debugEnabled) {
    return false;
  }
  if (debugTypesEnabled.empty()) {
    return true;
  }
  return debugTypesEnabled.count(type) > 0;
}